

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.cpp
# Opt level: O3

Connection * sqlite::Database::get(void)

{
  logic_error *this;
  
  if (db_ != (Connection *)0x0) {
    return db_;
  }
  this = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(this,"Database not initialized");
  __cxa_throw(this,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

Connection & Database::get()
    {
        if(!db_)
            throw std::logic_error("Database not initialized");

        return *db_;
    }